

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawSpanMaskedPalCommand::Execute(DrawSpanMaskedPalCommand *this,DrawerThread *thread)

{
  dsfixed_t dVar1;
  dsfixed_t dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  bool bVar8;
  uint uVar9;
  byte bVar10;
  int texdata_1;
  int xmask;
  uint8_t xshift;
  uint8_t yshift;
  int texdata;
  int spot;
  int count;
  uint8_t *colormap;
  uint8_t *source;
  uint8_t *dest;
  dsfixed_t ystep;
  dsfixed_t xstep;
  dsfixed_t yfrac;
  dsfixed_t xfrac;
  DrawerThread *thread_local;
  DrawSpanMaskedPalCommand *this_local;
  
  bVar8 = DrawerThread::line_skipped_by_thread(thread,(this->super_PalSpanCommand)._y);
  if (!bVar8) {
    puVar6 = (this->super_PalSpanCommand)._source;
    puVar7 = (this->super_PalSpanCommand)._colormap;
    xstep = (this->super_PalSpanCommand)._xfrac;
    ystep = (this->super_PalSpanCommand)._yfrac;
    source = (this->super_PalSpanCommand)._destorg +
             (*(int *)(ylookup + (long)(this->super_PalSpanCommand)._y * 4) +
             (this->super_PalSpanCommand)._x1);
    texdata = ((this->super_PalSpanCommand)._x2 - (this->super_PalSpanCommand)._x1) + 1;
    dVar1 = (this->super_PalSpanCommand)._xstep;
    dVar2 = (this->super_PalSpanCommand)._ystep;
    if (((this->super_PalSpanCommand)._xbits == 6) && ((this->super_PalSpanCommand)._ybits == 6)) {
      do {
        uVar9 = (uint)puVar6[(int)((xstep >> 0x14 & 0xfc0) + (ystep >> 0x1a))];
        if (uVar9 != 0) {
          *source = puVar7[(int)uVar9];
        }
        source = source + 1;
        xstep = dVar1 + xstep;
        ystep = dVar2 + ystep;
        texdata = texdata + -1;
      } while (texdata != 0);
    }
    else {
      bVar10 = 0x20 - (char)(this->super_PalSpanCommand)._ybits;
      iVar3 = (this->super_PalSpanCommand)._xbits;
      iVar4 = (this->super_PalSpanCommand)._xbits;
      iVar5 = (this->super_PalSpanCommand)._ybits;
      do {
        uVar9 = (uint)puVar6[(int)((xstep >> (bVar10 - (char)iVar3 & 0x1f) &
                                   (1 << ((byte)iVar4 & 0x1f)) + -1 << ((byte)iVar5 & 0x1f)) +
                                  (ystep >> (bVar10 & 0x1f)))];
        if (uVar9 != 0) {
          *source = puVar7[(int)uVar9];
        }
        source = source + 1;
        xstep = dVar1 + xstep;
        ystep = dVar2 + ystep;
        texdata = texdata + -1;
      } while (texdata != 0);
    }
  }
  return;
}

Assistant:

void DrawSpanMaskedPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(_y))
			return;

		dsfixed_t xfrac;
		dsfixed_t yfrac;
		dsfixed_t xstep;
		dsfixed_t ystep;
		uint8_t *dest;
		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		int count;
		int spot;

		xfrac = _xfrac;
		yfrac = _yfrac;

		dest = ylookup[_y] + _x1 + _destorg;

		count = _x2 - _x1 + 1;

		xstep = _xstep;
		ystep = _ystep;

		if (_xbits == 6 && _ybits == 6)
		{
			// 64x64 is the most common case by far, so special case it.
			do
			{
				int texdata;

				spot = ((xfrac >> (32 - 6 - 6))&(63 * 64)) + (yfrac >> (32 - 6));
				texdata = source[spot];
				if (texdata != 0)
				{
					*dest = colormap[texdata];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
		else
		{
			uint8_t yshift = 32 - _ybits;
			uint8_t xshift = yshift - _xbits;
			int xmask = ((1 << _xbits) - 1) << _ybits;
			do
			{
				int texdata;

				spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
				texdata = source[spot];
				if (texdata != 0)
				{
					*dest = colormap[texdata];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
	}